

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack8to1.h
# Opt level: O3

void ncnn::im2col_sgemm_pack8to1_avx
               (Mat *bottom_im2col,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  float *pfVar1;
  undefined4 uVar2;
  uint uVar3;
  uint uVar4;
  size_t sVar5;
  void *pvVar6;
  size_t sVar7;
  undefined1 auVar8 [16];
  float fVar9;
  int *piVar10;
  int iVar11;
  uint uVar12;
  long lVar13;
  undefined1 (*pauVar14) [32];
  long lVar15;
  float *pfVar16;
  ulong uVar17;
  ulong uVar18;
  uint uVar19;
  ulong uVar20;
  _func_int ***ppp_Var21;
  undefined1 (*pauVar22) [32];
  int iVar23;
  ulong uVar24;
  void **ppvVar25;
  undefined1 (*pauVar26) [32];
  undefined1 (*pauVar27) [32];
  uint uVar28;
  undefined1 (*pauVar29) [32];
  undefined1 (*pauVar30) [32];
  ulong uVar31;
  undefined1 (*pauVar32) [32];
  uint uVar33;
  long lVar34;
  void **ppvVar35;
  undefined1 auVar36 [16];
  float fVar37;
  float fVar45;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  float fVar43;
  float fVar44;
  float fVar46;
  float fVar47;
  float fVar48;
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  float fVar49;
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  float zeros [8];
  undefined1 (*local_f8) [32];
  undefined1 local_c8 [64];
  size_t local_88;
  ulong local_78;
  ulong local_70;
  Mat *local_68;
  Mat *local_60;
  void *local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  
  uVar3 = bottom_im2col->w;
  uVar31 = (ulong)(int)uVar3;
  uVar12 = bottom_im2col->h;
  uVar17 = (ulong)uVar12;
  uVar19 = bottom_im2col->c;
  uVar4 = top_blob->c;
  local_88 = 0;
  local_c8._0_8_ = (Allocator *)0x0;
  local_c8._8_4_ = 0;
  local_c8._12_4_ = 0;
  local_c8._16_8_ = SUB168(ZEXT816(0) << 0x40,4);
  local_c8._24_4_ = 0;
  local_c8._48_12_ = SUB1612(ZEXT816(0) << 0x40,4);
  uVar28 = (uVar3 & 7) + (uVar3 >> 3);
  uVar33 = uVar12 * 8;
  if ((long)uVar31 < 8) {
    uVar28 = uVar3;
    uVar33 = uVar12;
  }
  local_c8._32_8_ = local_c8._0_8_;
  local_c8._40_4_ = local_c8._8_4_;
  local_c8._44_4_ = local_c8._12_4_;
  Mat::create((Mat *)local_c8,uVar33,uVar19,uVar28,0x20,8,(Allocator *)opt);
  if (0 < (int)uVar3 >> 3) {
    lVar13 = 0x80;
    uVar20 = 0;
    do {
      if (0 < (int)uVar19) {
        ppp_Var21 = (_func_int ***)
                    ((long)(_func_int ***)local_c8._0_8_ + local_88 * uVar20 * local_c8._16_8_);
        uVar24 = 0;
        do {
          if (0 < (int)uVar12) {
            pauVar26 = (undefined1 (*) [32])
                       ((long)bottom_im2col->data +
                       bottom_im2col->cstep * bottom_im2col->elemsize * uVar24 + lVar13);
            uVar18 = uVar17;
            do {
              auVar40 = vunpcklps_avx(pauVar26[-4],pauVar26[-3]);
              auVar50 = vunpckhps_avx(pauVar26[-4],pauVar26[-3]);
              auVar57 = vunpcklps_avx(pauVar26[-2],pauVar26[-1]);
              auVar52 = vunpckhps_avx(pauVar26[-2],pauVar26[-1]);
              auVar41 = vunpcklps_avx(*pauVar26,pauVar26[1]);
              auVar53 = vunpckhps_avx(*pauVar26,pauVar26[1]);
              auVar55 = vunpcklps_avx(pauVar26[2],pauVar26[3]);
              auVar54 = vunpckhps_avx(pauVar26[2],pauVar26[3]);
              auVar56 = vunpcklpd_avx(auVar40,auVar57);
              auVar40 = vunpckhpd_avx(auVar40,auVar57);
              auVar57 = vunpcklpd_avx(auVar50,auVar52);
              auVar50 = vunpckhpd_avx(auVar50,auVar52);
              auVar58 = vunpcklpd_avx(auVar41,auVar55);
              auVar52 = vunpckhpd_avx(auVar41,auVar55);
              auVar41 = vunpcklpd_avx(auVar53,auVar54);
              auVar53 = vunpckhpd_avx(auVar53,auVar54);
              auVar55._16_16_ = auVar58._0_16_;
              auVar55._0_16_ = auVar56._0_16_;
              auVar60._16_16_ = auVar52._0_16_;
              auVar60._0_16_ = auVar40._0_16_;
              auVar61._16_16_ = auVar41._0_16_;
              auVar61._0_16_ = auVar57._0_16_;
              auVar62._16_16_ = auVar53._0_16_;
              auVar62._0_16_ = auVar50._0_16_;
              auVar54 = vperm2f128_avx(auVar56,auVar58,0x31);
              auVar40 = vperm2f128_avx(auVar40,auVar52,0x31);
              auVar52 = vperm2f128_avx(auVar57,auVar41,0x31);
              auVar50 = vperm2f128_avx(auVar50,auVar53,0x31);
              *(undefined1 (*) [32])ppp_Var21 = auVar55;
              *(undefined1 (*) [32])(ppp_Var21 + 4) = auVar60;
              *(undefined1 (*) [32])(ppp_Var21 + 8) = auVar61;
              *(undefined1 (*) [32])(ppp_Var21 + 0xc) = auVar62;
              *(undefined1 (*) [32])(ppp_Var21 + 0x10) = auVar54;
              *(undefined1 (*) [32])(ppp_Var21 + 0x14) = auVar40;
              *(undefined1 (*) [32])(ppp_Var21 + 0x18) = auVar52;
              *(undefined1 (*) [32])(ppp_Var21 + 0x1c) = auVar50;
              ppp_Var21 = ppp_Var21 + 0x20;
              pauVar26 = (undefined1 (*) [32])(*pauVar26 + (long)(int)(uVar3 * 8) * 4);
              uVar28 = (int)uVar18 - 1;
              uVar18 = (ulong)uVar28;
            } while (uVar28 != 0);
          }
          uVar24 = uVar24 + 1;
        } while (uVar24 != uVar19);
      }
      uVar20 = uVar20 + 1;
      lVar13 = lVar13 + 0x100;
    } while (uVar20 != (uint)((int)uVar3 >> 3));
  }
  uVar20 = uVar31 & 0xfffffffffffffff8;
  if ((uint)uVar20 != uVar3) {
    lVar13 = uVar20 << 5;
    do {
      if (0 < (int)uVar19) {
        uVar28 = (uint)uVar20;
        uVar33 = uVar28 + 7;
        if (-1 < (int)uVar28) {
          uVar33 = uVar28;
        }
        ppp_Var21 = (_func_int ***)
                    ((long)(_func_int ***)local_c8._0_8_ +
                    (long)(int)(((int)uVar33 >> 3) + (uVar28 - (uVar33 & 0xfffffff8))) * local_88 *
                    local_c8._16_8_);
        uVar24 = 0;
        do {
          if (0 < (int)uVar12) {
            pauVar26 = (undefined1 (*) [32])
                       ((long)bottom_im2col->data +
                       bottom_im2col->cstep * bottom_im2col->elemsize * uVar24 + lVar13);
            uVar18 = uVar17;
            do {
              *(undefined1 (*) [32])ppp_Var21 = *pauVar26;
              ppp_Var21 = ppp_Var21 + 4;
              pauVar26 = (undefined1 (*) [32])(*pauVar26 + (long)(int)(uVar3 * 8) * 4);
              uVar28 = (int)uVar18 - 1;
              uVar18 = (ulong)uVar28;
            } while (uVar28 != 0);
          }
          uVar24 = uVar24 + 1;
        } while (uVar24 != uVar19);
      }
      uVar20 = uVar20 + 1;
      lVar13 = lVar13 + 0x20;
    } while ((long)uVar20 < (long)uVar31);
  }
  uVar28 = uVar4 + 7;
  if (-1 < (int)uVar4) {
    uVar28 = uVar4;
  }
  if (7 < (int)uVar4) {
    iVar11 = uVar19 * uVar12;
    local_78 = (ulong)(uint)((int)uVar28 >> 3);
    uVar20 = 0;
    do {
      sVar5 = top_blob->cstep;
      pvVar6 = top_blob->data;
      sVar7 = top_blob->elemsize;
      local_f8 = (undefined1 (*) [32])(uVar20 * 8 * sVar5 * sVar7 + (long)pvVar6);
      pauVar27 = (undefined1 (*) [32])((uVar20 * 8 + 1) * sVar5 * sVar7 + (long)pvVar6);
      pauVar29 = (undefined1 (*) [32])((uVar20 * 8 + 2) * sVar5 * sVar7 + (long)pvVar6);
      pauVar30 = (undefined1 (*) [32])((uVar20 * 8 + 3) * sVar5 * sVar7 + (long)pvVar6);
      pauVar32 = (undefined1 (*) [32])((uVar20 * 8 + 4) * sVar5 * sVar7 + (long)pvVar6);
      pauVar26 = (undefined1 (*) [32])((uVar20 * 8 + 5) * sVar5 * sVar7 + (long)pvVar6);
      pauVar22 = (undefined1 (*) [32])((uVar20 * 8 + 6) * sVar5 * sVar7 + (long)pvVar6);
      pauVar14 = (undefined1 (*) [32])((uVar20 * 8 + 7) * sVar5 * sVar7 + (long)pvVar6);
      ppvVar25 = &_bias->data + uVar20 * 4;
      if (_bias == (Mat *)0x0) {
        ppvVar25 = &local_58;
      }
      local_58 = (void *)0x0;
      uStack_50 = 0;
      uStack_48 = 0;
      uStack_40 = 0;
      if ((int)uVar3 < 8) {
        uVar24 = 0;
      }
      else {
        ppvVar35 = &_bias->data + uVar20 * 4;
        if (_bias == (Mat *)0x0) {
          ppvVar35 = &local_58;
        }
        lVar13 = 0;
        uVar18 = 0;
        do {
          uVar2 = *(undefined4 *)ppvVar25;
          auVar58._4_4_ = (float)uVar2;
          auVar58._0_4_ = (float)uVar2;
          auVar58._8_4_ = (float)uVar2;
          auVar58._12_4_ = (float)uVar2;
          auVar58._16_4_ = (float)uVar2;
          auVar58._20_4_ = (float)uVar2;
          auVar58._24_4_ = (float)uVar2;
          auVar58._28_4_ = (float)uVar2;
          uVar2 = *(undefined4 *)((long)ppvVar35 + 4);
          auVar57._4_4_ = (float)uVar2;
          auVar57._0_4_ = (float)uVar2;
          auVar57._8_4_ = (float)uVar2;
          auVar57._12_4_ = (float)uVar2;
          auVar57._16_4_ = (float)uVar2;
          auVar57._20_4_ = (float)uVar2;
          auVar57._24_4_ = (float)uVar2;
          auVar57._28_4_ = (float)uVar2;
          uVar2 = *(undefined4 *)(ppvVar35 + 1);
          auVar56._4_4_ = (float)uVar2;
          auVar56._0_4_ = (float)uVar2;
          auVar56._8_4_ = (float)uVar2;
          auVar56._12_4_ = (float)uVar2;
          auVar56._16_4_ = (float)uVar2;
          auVar56._20_4_ = (float)uVar2;
          auVar56._24_4_ = (float)uVar2;
          auVar56._28_4_ = (float)uVar2;
          uVar2 = *(undefined4 *)((long)ppvVar35 + 0xc);
          auVar54._4_4_ = (float)uVar2;
          auVar54._0_4_ = (float)uVar2;
          auVar54._8_4_ = (float)uVar2;
          auVar54._12_4_ = (float)uVar2;
          auVar54._16_4_ = (float)uVar2;
          auVar54._20_4_ = (float)uVar2;
          auVar54._24_4_ = (float)uVar2;
          auVar54._28_4_ = (float)uVar2;
          uVar2 = SUB84(ppvVar35[2],0);
          auVar53._4_4_ = (float)uVar2;
          auVar53._0_4_ = (float)uVar2;
          auVar53._8_4_ = (float)uVar2;
          auVar53._12_4_ = (float)uVar2;
          auVar53._16_4_ = (float)uVar2;
          auVar53._20_4_ = (float)uVar2;
          auVar53._24_4_ = (float)uVar2;
          auVar53._28_4_ = (float)uVar2;
          uVar2 = *(undefined4 *)((long)ppvVar35 + 0x14);
          auVar52._4_4_ = (float)uVar2;
          auVar52._0_4_ = (float)uVar2;
          auVar52._8_4_ = (float)uVar2;
          auVar52._12_4_ = (float)uVar2;
          auVar52._16_4_ = (float)uVar2;
          auVar52._20_4_ = (float)uVar2;
          auVar52._24_4_ = (float)uVar2;
          auVar52._28_4_ = (float)uVar2;
          iVar23 = *(int *)(ppvVar35 + 3);
          auVar50._4_4_ = (float)iVar23;
          auVar50._0_4_ = (float)iVar23;
          auVar50._8_4_ = (float)iVar23;
          auVar50._12_4_ = (float)iVar23;
          auVar50._16_4_ = (float)iVar23;
          auVar50._20_4_ = (float)iVar23;
          auVar50._24_4_ = (float)iVar23;
          auVar50._28_4_ = (float)iVar23;
          uVar2 = *(undefined4 *)((long)ppvVar35 + 0x1c);
          auVar40._4_4_ = (float)uVar2;
          auVar40._0_4_ = (float)uVar2;
          auVar40._8_4_ = (float)uVar2;
          auVar40._12_4_ = (float)uVar2;
          auVar40._16_4_ = (float)uVar2;
          auVar40._20_4_ = (float)uVar2;
          auVar40._24_4_ = (float)uVar2;
          auVar40._28_4_ = (float)uVar2;
          if (0 < iVar11 * 8) {
            lVar34 = kernel->cstep * uVar20 * kernel->elemsize;
            pvVar6 = kernel->data;
            lVar15 = 0;
            iVar23 = iVar11 * 8;
            auVar41 = auVar40;
            auVar55 = auVar50;
            auVar60 = auVar52;
            auVar61 = auVar53;
            auVar62 = auVar54;
            auVar42 = auVar56;
            auVar51 = auVar57;
            auVar59 = auVar58;
            do {
              pfVar16 = (float *)((long)(_func_int ***)local_c8._0_8_ +
                                 lVar15 + local_88 * local_c8._16_8_ * lVar13);
              fVar44 = *pfVar16;
              fVar45 = pfVar16[1];
              fVar46 = pfVar16[2];
              fVar47 = pfVar16[3];
              fVar48 = pfVar16[4];
              fVar49 = pfVar16[5];
              fVar9 = pfVar16[6];
              fVar37 = *(float *)((long)pvVar6 + lVar15 + lVar34);
              fVar43 = *(float *)((long)pvVar6 + lVar15 + lVar34 + 4);
              auVar58._0_4_ = fVar37 * fVar44 + auVar59._0_4_;
              auVar58._4_4_ = fVar37 * fVar45 + auVar59._4_4_;
              auVar58._8_4_ = fVar37 * fVar46 + auVar59._8_4_;
              auVar58._12_4_ = fVar37 * fVar47 + auVar59._12_4_;
              auVar58._16_4_ = fVar37 * fVar48 + auVar59._16_4_;
              auVar58._20_4_ = fVar37 * fVar49 + auVar59._20_4_;
              auVar58._24_4_ = fVar37 * fVar9 + auVar59._24_4_;
              auVar58._28_4_ = fVar37 + auVar59._28_4_;
              auVar57._0_4_ = fVar43 * fVar44 + auVar51._0_4_;
              auVar57._4_4_ = fVar43 * fVar45 + auVar51._4_4_;
              auVar57._8_4_ = fVar43 * fVar46 + auVar51._8_4_;
              auVar57._12_4_ = fVar43 * fVar47 + auVar51._12_4_;
              auVar57._16_4_ = fVar43 * fVar48 + auVar51._16_4_;
              auVar57._20_4_ = fVar43 * fVar49 + auVar51._20_4_;
              auVar57._24_4_ = fVar43 * fVar9 + auVar51._24_4_;
              auVar57._28_4_ = fVar37 + auVar51._28_4_;
              fVar37 = *(float *)((long)pvVar6 + lVar15 + lVar34 + 8);
              fVar43 = *(float *)((long)pvVar6 + lVar15 + lVar34 + 0xc);
              auVar56._0_4_ = fVar37 * fVar44 + auVar42._0_4_;
              auVar56._4_4_ = fVar37 * fVar45 + auVar42._4_4_;
              auVar56._8_4_ = fVar37 * fVar46 + auVar42._8_4_;
              auVar56._12_4_ = fVar37 * fVar47 + auVar42._12_4_;
              auVar56._16_4_ = fVar37 * fVar48 + auVar42._16_4_;
              auVar56._20_4_ = fVar37 * fVar49 + auVar42._20_4_;
              auVar56._24_4_ = fVar37 * fVar9 + auVar42._24_4_;
              auVar56._28_4_ = fVar37 + auVar42._28_4_;
              auVar54._0_4_ = fVar43 * fVar44 + auVar62._0_4_;
              auVar54._4_4_ = fVar43 * fVar45 + auVar62._4_4_;
              auVar54._8_4_ = fVar43 * fVar46 + auVar62._8_4_;
              auVar54._12_4_ = fVar43 * fVar47 + auVar62._12_4_;
              auVar54._16_4_ = fVar43 * fVar48 + auVar62._16_4_;
              auVar54._20_4_ = fVar43 * fVar49 + auVar62._20_4_;
              auVar54._24_4_ = fVar43 * fVar9 + auVar62._24_4_;
              auVar54._28_4_ = fVar37 + auVar62._28_4_;
              fVar37 = *(float *)((long)pvVar6 + lVar15 + lVar34 + 0x10);
              fVar43 = *(float *)((long)pvVar6 + lVar15 + lVar34 + 0x14);
              auVar53._0_4_ = fVar37 * fVar44 + auVar61._0_4_;
              auVar53._4_4_ = fVar37 * fVar45 + auVar61._4_4_;
              auVar53._8_4_ = fVar37 * fVar46 + auVar61._8_4_;
              auVar53._12_4_ = fVar37 * fVar47 + auVar61._12_4_;
              auVar53._16_4_ = fVar37 * fVar48 + auVar61._16_4_;
              auVar53._20_4_ = fVar37 * fVar49 + auVar61._20_4_;
              auVar53._24_4_ = fVar37 * fVar9 + auVar61._24_4_;
              auVar53._28_4_ = fVar37 + auVar61._28_4_;
              auVar52._0_4_ = fVar43 * fVar44 + auVar60._0_4_;
              auVar52._4_4_ = fVar43 * fVar45 + auVar60._4_4_;
              auVar52._8_4_ = fVar43 * fVar46 + auVar60._8_4_;
              auVar52._12_4_ = fVar43 * fVar47 + auVar60._12_4_;
              auVar52._16_4_ = fVar43 * fVar48 + auVar60._16_4_;
              auVar52._20_4_ = fVar43 * fVar49 + auVar60._20_4_;
              auVar52._24_4_ = fVar43 * fVar9 + auVar60._24_4_;
              auVar52._28_4_ = fVar37 + auVar60._28_4_;
              fVar37 = *(float *)((long)pvVar6 + lVar15 + lVar34 + 0x18);
              fVar43 = *(float *)((long)pvVar6 + lVar15 + lVar34 + 0x1c);
              auVar50._0_4_ = fVar37 * fVar44 + auVar55._0_4_;
              auVar50._4_4_ = fVar37 * fVar45 + auVar55._4_4_;
              auVar50._8_4_ = fVar37 * fVar46 + auVar55._8_4_;
              auVar50._12_4_ = fVar37 * fVar47 + auVar55._12_4_;
              auVar50._16_4_ = fVar37 * fVar48 + auVar55._16_4_;
              auVar50._20_4_ = fVar37 * fVar49 + auVar55._20_4_;
              auVar50._24_4_ = fVar37 * fVar9 + auVar55._24_4_;
              auVar50._28_4_ = fVar37 + auVar55._28_4_;
              auVar40._0_4_ = fVar43 * fVar44 + auVar41._0_4_;
              auVar40._4_4_ = fVar43 * fVar45 + auVar41._4_4_;
              auVar40._8_4_ = fVar43 * fVar46 + auVar41._8_4_;
              auVar40._12_4_ = fVar43 * fVar47 + auVar41._12_4_;
              auVar40._16_4_ = fVar43 * fVar48 + auVar41._16_4_;
              auVar40._20_4_ = fVar43 * fVar49 + auVar41._20_4_;
              auVar40._24_4_ = fVar43 * fVar9 + auVar41._24_4_;
              auVar40._28_4_ = pfVar16[7] + auVar41._28_4_;
              lVar15 = lVar15 + 0x20;
              iVar23 = iVar23 + -1;
              auVar41 = auVar40;
              auVar55 = auVar50;
              auVar60 = auVar52;
              auVar61 = auVar53;
              auVar62 = auVar54;
              auVar42 = auVar56;
              auVar51 = auVar57;
              auVar59 = auVar58;
            } while (iVar23 != 0);
          }
          *local_f8 = auVar58;
          *pauVar27 = auVar57;
          *pauVar29 = auVar56;
          *pauVar30 = auVar54;
          *pauVar32 = auVar53;
          *pauVar26 = auVar52;
          *pauVar22 = auVar50;
          *pauVar14 = auVar40;
          local_f8 = local_f8 + 1;
          pauVar27 = pauVar27 + 1;
          pauVar29 = pauVar29 + 1;
          pauVar30 = pauVar30 + 1;
          pauVar32 = pauVar32 + 1;
          pauVar26 = pauVar26 + 1;
          pauVar22 = pauVar22 + 1;
          pauVar14 = pauVar14 + 1;
          uVar24 = uVar18 + 8;
          lVar15 = uVar18 + 0xf;
          lVar13 = lVar13 + 1;
          uVar18 = uVar24;
        } while (lVar15 < (long)uVar31);
      }
      if ((int)uVar24 < (int)uVar3) {
        sVar5 = kernel->cstep;
        sVar7 = kernel->elemsize;
        pvVar6 = kernel->data;
        do {
          auVar41 = *(undefined1 (*) [32])ppvVar25;
          if (0 < iVar11 * 8) {
            lVar13 = 0;
            pfVar16 = (float *)(sVar5 * uVar20 * sVar7 + (long)pvVar6);
            auVar40 = auVar41;
            do {
              fVar37 = *(float *)((long)(_func_int ***)local_c8._0_8_ +
                                 lVar13 * 4 +
                                 (ulong)(((uint)uVar24 & 7) + ((uint)(uVar24 >> 3) & 0x1fffffff)) *
                                 local_88 * local_c8._16_8_);
              auVar41._0_4_ = fVar37 * *pfVar16 + auVar40._0_4_;
              auVar41._4_4_ = fVar37 * pfVar16[1] + auVar40._4_4_;
              auVar41._8_4_ = fVar37 * pfVar16[2] + auVar40._8_4_;
              auVar41._12_4_ = fVar37 * pfVar16[3] + auVar40._12_4_;
              auVar41._16_4_ = fVar37 * pfVar16[4] + auVar40._16_4_;
              auVar41._20_4_ = fVar37 * pfVar16[5] + auVar40._20_4_;
              auVar41._24_4_ = fVar37 * pfVar16[6] + auVar40._24_4_;
              auVar41._28_4_ = fVar37 + auVar40._28_4_;
              pfVar16 = pfVar16 + 8;
              lVar13 = lVar13 + 1;
              auVar40 = auVar41;
            } while (iVar11 * 8 != (int)lVar13);
          }
          *(int *)*local_f8 = auVar41._0_4_;
          auVar36 = auVar41._0_16_;
          uVar2 = vextractps_avx(auVar36,1);
          *(undefined4 *)*pauVar27 = uVar2;
          uVar2 = vextractps_avx(auVar36,2);
          *(undefined4 *)*pauVar29 = uVar2;
          uVar2 = vextractps_avx(auVar36,3);
          *(undefined4 *)*pauVar30 = uVar2;
          auVar36 = auVar41._16_16_;
          *(int *)*pauVar32 = auVar41._16_4_;
          uVar2 = vextractps_avx(auVar36,1);
          *(undefined4 *)*pauVar26 = uVar2;
          uVar2 = vextractps_avx(auVar36,2);
          *(undefined4 *)*pauVar22 = uVar2;
          uVar2 = vextractps_avx(auVar36,3);
          *(undefined4 *)*pauVar14 = uVar2;
          local_f8 = (undefined1 (*) [32])((long)*local_f8 + 4);
          pauVar27 = (undefined1 (*) [32])((long)*pauVar27 + 4);
          pauVar29 = (undefined1 (*) [32])((long)*pauVar29 + 4);
          pauVar30 = (undefined1 (*) [32])((long)*pauVar30 + 4);
          pauVar32 = (undefined1 (*) [32])((long)*pauVar32 + 4);
          pauVar26 = (undefined1 (*) [32])((long)*pauVar26 + 4);
          pauVar22 = (undefined1 (*) [32])((long)*pauVar22 + 4);
          pauVar14 = (undefined1 (*) [32])((long)*pauVar14 + 4);
          uVar33 = (uint)uVar24 + 1;
          uVar24 = (ulong)uVar33;
        } while (uVar33 != uVar3);
      }
      uVar20 = uVar20 + 1;
      local_70 = uVar17;
      local_68 = top_blob;
      local_60 = _bias;
    } while (uVar20 != local_78);
  }
  if ((int)(uVar28 & 0xfffffff8) < (int)uVar4) {
    iVar11 = uVar12 * uVar19;
    lVar13 = (long)(int)(uVar28 & 0xfffffff8);
    do {
      if (_bias == (Mat *)0x0) {
        auVar36 = ZEXT816(0) << 0x40;
      }
      else {
        auVar36 = ZEXT416(*(uint *)((long)&_bias->data + lVar13 * 4));
      }
      pauVar26 = (undefined1 (*) [32])
                 (top_blob->cstep * lVar13 * top_blob->elemsize + (long)top_blob->data);
      uVar17 = 0;
      uVar12 = (uint)lVar13;
      if (7 < (int)uVar3) {
        uVar19 = uVar12 + 7;
        if (-1 < (int)uVar12) {
          uVar19 = uVar12;
        }
        auVar8 = vshufps_avx(auVar36,auVar36,0);
        auVar42._16_16_ = auVar8;
        auVar42._0_16_ = auVar8;
        uVar20 = 0;
        do {
          auVar51 = auVar42;
          if (0 < iVar11 * 8) {
            ppp_Var21 = (_func_int ***)
                        ((long)(_func_int ***)local_c8._0_8_ +
                        (uVar20 >> 3) * local_88 * local_c8._16_8_);
            lVar15 = 0;
            auVar40 = auVar42;
            do {
              fVar37 = *(float *)((long)kernel->data +
                                 lVar15 * 4 +
                                 kernel->cstep *
                                 (long)(int)(((int)uVar19 >> 3) + (uVar12 - (uVar19 & 0xfffffff8)))
                                 * kernel->elemsize);
              auVar51._0_4_ = fVar37 * *(float *)ppp_Var21 + auVar40._0_4_;
              auVar51._4_4_ = fVar37 * *(float *)((long)ppp_Var21 + 4) + auVar40._4_4_;
              auVar51._8_4_ = fVar37 * *(float *)(ppp_Var21 + 1) + auVar40._8_4_;
              auVar51._12_4_ = fVar37 * *(float *)((long)(ppp_Var21 + 1) + 4) + auVar40._12_4_;
              auVar51._16_4_ = fVar37 * *(float *)(ppp_Var21 + 2) + auVar40._16_4_;
              auVar51._20_4_ = fVar37 * *(float *)((long)(ppp_Var21 + 2) + 4) + auVar40._20_4_;
              auVar51._24_4_ = fVar37 * *(float *)(ppp_Var21 + 3) + auVar40._24_4_;
              auVar51._28_4_ = fVar37 + auVar40._28_4_;
              ppp_Var21 = ppp_Var21 + 4;
              lVar15 = lVar15 + 1;
              auVar40 = auVar51;
            } while (iVar11 * 8 != (int)lVar15);
          }
          *pauVar26 = auVar51;
          pauVar26 = pauVar26 + 1;
          uVar17 = uVar20 + 8;
          lVar15 = uVar20 + 0xf;
          uVar20 = uVar17;
        } while (lVar15 < (long)uVar31);
      }
      if ((int)uVar17 < (int)uVar3) {
        uVar19 = uVar12 + 7;
        if (-1 < (int)uVar12) {
          uVar19 = uVar12;
        }
        sVar5 = kernel->cstep;
        sVar7 = kernel->elemsize;
        pvVar6 = kernel->data;
        do {
          if (iVar11 < 1) {
            fVar37 = 0.0;
            fVar43 = 0.0;
            fVar44 = 0.0;
            fVar45 = 0.0;
            fVar46 = 0.0;
            fVar47 = 0.0;
            fVar48 = 0.0;
            fVar49 = 0.0;
          }
          else {
            fVar37 = 0.0;
            fVar43 = 0.0;
            fVar44 = 0.0;
            fVar45 = 0.0;
            fVar46 = 0.0;
            fVar47 = 0.0;
            fVar48 = 0.0;
            fVar49 = 0.0;
            lVar15 = 0;
            iVar23 = iVar11;
            do {
              pfVar16 = (float *)((long)pvVar6 +
                                 lVar15 + (long)(int)(((int)uVar19 >> 3) +
                                                     (uVar12 - (uVar19 & 0xfffffff8))) * sVar5 *
                                          sVar7);
              pfVar1 = (float *)((long)(_func_int ***)local_c8._0_8_ +
                                lVar15 + (ulong)(((uint)uVar17 & 7) +
                                                ((uint)(uVar17 >> 3) & 0x1fffffff)) *
                                         local_88 * local_c8._16_8_);
              fVar37 = *pfVar16 * *pfVar1 + fVar37;
              fVar43 = pfVar16[1] * pfVar1[1] + fVar43;
              fVar44 = pfVar16[2] * pfVar1[2] + fVar44;
              fVar45 = pfVar16[3] * pfVar1[3] + fVar45;
              fVar46 = pfVar16[4] * pfVar1[4] + fVar46;
              fVar47 = pfVar16[5] * pfVar1[5] + fVar47;
              fVar48 = pfVar16[6] * pfVar1[6] + fVar48;
              fVar49 = pfVar16[7] + fVar49;
              lVar15 = lVar15 + 0x20;
              iVar23 = iVar23 + -1;
            } while (iVar23 != 0);
          }
          auVar38._0_4_ = fVar46 + fVar37;
          auVar38._4_4_ = fVar47 + fVar43;
          auVar38._8_4_ = fVar48 + fVar44;
          auVar38._12_4_ = fVar49 + fVar45;
          auVar8 = vshufpd_avx(auVar38,auVar38,1);
          auVar39._0_4_ = auVar8._0_4_ + auVar38._0_4_;
          auVar39._4_4_ = auVar8._4_4_ + auVar38._4_4_;
          auVar39._8_4_ = auVar8._8_4_ + auVar38._8_4_;
          auVar39._12_4_ = auVar8._12_4_ + auVar38._12_4_;
          auVar8 = vmovshdup_avx(auVar39);
          *(float *)*pauVar26 = auVar8._0_4_ + auVar36._0_4_ + auVar39._0_4_;
          pauVar26 = (undefined1 (*) [32])((long)*pauVar26 + 4);
          uVar28 = (uint)uVar17 + 1;
          uVar17 = (ulong)uVar28;
        } while (uVar28 != uVar3);
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 != (int)uVar4);
  }
  piVar10 = (int *)CONCAT44(local_c8._12_4_,local_c8._8_4_);
  if (piVar10 != (int *)0x0) {
    LOCK();
    *piVar10 = *piVar10 + -1;
    UNLOCK();
    if (*piVar10 == 0) {
      if ((Allocator *)local_c8._32_8_ == (Allocator *)0x0) {
        if ((Allocator *)local_c8._0_8_ != (Allocator *)0x0) {
          free((void *)local_c8._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_c8._32_8_)[3])();
      }
    }
  }
  return;
}

Assistant:

static void im2col_sgemm_pack8to1_avx(const Mat& bottom_im2col, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    // Mat bottom_im2col(size, maxk, inch, 4u * 8, 8, opt.workspace_allocator);

    const int size = bottom_im2col.w;
    const int maxk = bottom_im2col.h;
    const int inch = bottom_im2col.c;

    const int outch = top_blob.c;

    const float* bias = _bias;

    Mat tmp;
    if (size >= 8)
        tmp.create(8 * maxk, inch, size / 8 + size % 8, 4u * 8, 8, opt.workspace_allocator);
    else
        tmp.create(maxk, inch, size, 4u * 8, 8, opt.workspace_allocator);
    {
        int remain_size_start = 0;
        int nn_size = size >> 3;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = ii * 8;

            float* tmpptr = tmp.channel(i / 8);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i * 8;

                for (int k = 0; k < maxk; k++)
                {
                    // transpose 8x8
                    __m256 _r0 = _mm256_load_ps(img0);
                    __m256 _r1 = _mm256_load_ps(img0 + 8);
                    __m256 _r2 = _mm256_load_ps(img0 + 8 * 2);
                    __m256 _r3 = _mm256_load_ps(img0 + 8 * 3);
                    __m256 _r4 = _mm256_load_ps(img0 + 8 * 4);
                    __m256 _r5 = _mm256_load_ps(img0 + 8 * 5);
                    __m256 _r6 = _mm256_load_ps(img0 + 8 * 6);
                    __m256 _r7 = _mm256_load_ps(img0 + 8 * 7);

                    __m256 _tmp0 = _mm256_unpacklo_ps(_r0, _r1);
                    __m256 _tmp1 = _mm256_unpackhi_ps(_r0, _r1);
                    __m256 _tmp2 = _mm256_unpacklo_ps(_r2, _r3);
                    __m256 _tmp3 = _mm256_unpackhi_ps(_r2, _r3);
                    __m256 _tmp4 = _mm256_unpacklo_ps(_r4, _r5);
                    __m256 _tmp5 = _mm256_unpackhi_ps(_r4, _r5);
                    __m256 _tmp6 = _mm256_unpacklo_ps(_r6, _r7);
                    __m256 _tmp7 = _mm256_unpackhi_ps(_r6, _r7);
                    __m256 _tmp8 = _mm256_shuffle_ps(_tmp0, _tmp2, _MM_SHUFFLE(1, 0, 1, 0));
                    __m256 _tmp9 = _mm256_shuffle_ps(_tmp0, _tmp2, _MM_SHUFFLE(3, 2, 3, 2));
                    __m256 _tmpa = _mm256_shuffle_ps(_tmp1, _tmp3, _MM_SHUFFLE(1, 0, 1, 0));
                    __m256 _tmpb = _mm256_shuffle_ps(_tmp1, _tmp3, _MM_SHUFFLE(3, 2, 3, 2));
                    __m256 _tmpc = _mm256_shuffle_ps(_tmp4, _tmp6, _MM_SHUFFLE(1, 0, 1, 0));
                    __m256 _tmpd = _mm256_shuffle_ps(_tmp4, _tmp6, _MM_SHUFFLE(3, 2, 3, 2));
                    __m256 _tmpe = _mm256_shuffle_ps(_tmp5, _tmp7, _MM_SHUFFLE(1, 0, 1, 0));
                    __m256 _tmpf = _mm256_shuffle_ps(_tmp5, _tmp7, _MM_SHUFFLE(3, 2, 3, 2));
                    _r0 = _mm256_permute2f128_ps(_tmp8, _tmpc, _MM_SHUFFLE(0, 2, 0, 0));
                    _r1 = _mm256_permute2f128_ps(_tmp9, _tmpd, _MM_SHUFFLE(0, 2, 0, 0));
                    _r2 = _mm256_permute2f128_ps(_tmpa, _tmpe, _MM_SHUFFLE(0, 2, 0, 0));
                    _r3 = _mm256_permute2f128_ps(_tmpb, _tmpf, _MM_SHUFFLE(0, 2, 0, 0));
                    _r4 = _mm256_permute2f128_ps(_tmp8, _tmpc, _MM_SHUFFLE(0, 3, 0, 1));
                    _r5 = _mm256_permute2f128_ps(_tmp9, _tmpd, _MM_SHUFFLE(0, 3, 0, 1));
                    _r6 = _mm256_permute2f128_ps(_tmpa, _tmpe, _MM_SHUFFLE(0, 3, 0, 1));
                    _r7 = _mm256_permute2f128_ps(_tmpb, _tmpf, _MM_SHUFFLE(0, 3, 0, 1));

                    _mm256_store_ps(tmpptr, _r0);
                    _mm256_store_ps(tmpptr + 8, _r1);
                    _mm256_store_ps(tmpptr + 8 * 2, _r2);
                    _mm256_store_ps(tmpptr + 8 * 3, _r3);
                    _mm256_store_ps(tmpptr + 8 * 4, _r4);
                    _mm256_store_ps(tmpptr + 8 * 5, _r5);
                    _mm256_store_ps(tmpptr + 8 * 6, _r6);
                    _mm256_store_ps(tmpptr + 8 * 7, _r7);

                    img0 += size * 8;
                    tmpptr += 64;
                }
            }
        }

        remain_size_start += nn_size << 3;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = remain_size_start; i < size; i++)
        {
            float* tmpptr = tmp.channel(i / 8 + i % 8);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i * 8;

                for (int k = 0; k < maxk; k++)
                {
                    __m256 _val = _mm256_load_ps(img0);
                    _mm256_store_ps(tmpptr, _val);

                    img0 += size * 8;
                    tmpptr += 8;
                }
            }
        }
    }

    int nn_outch = outch / 8;
    int remain_outch_start = nn_outch * 8;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int pp = 0; pp < nn_outch; pp++)
    {
        int p = pp * 8;

        float* outptr0 = top_blob.channel(p);
        float* outptr1 = top_blob.channel(p + 1);
        float* outptr2 = top_blob.channel(p + 2);
        float* outptr3 = top_blob.channel(p + 3);
        float* outptr4 = top_blob.channel(p + 4);
        float* outptr5 = top_blob.channel(p + 5);
        float* outptr6 = top_blob.channel(p + 6);
        float* outptr7 = top_blob.channel(p + 7);

        const float zeros[8] = {0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f};
        const float* biasptr = bias ? bias + p : zeros;

        int i = 0;
        for (; i + 7 < size; i += 8)
        {
            const float* tmpptr = tmp.channel(i / 8);
            const float* kptr0 = kernel.channel(p / 8);

            int nn = inch * maxk * 8; // inch always > 0

            __m256 _sum0 = _mm256_broadcast_ss(biasptr);
            __m256 _sum1 = _mm256_broadcast_ss(biasptr + 1);
            __m256 _sum2 = _mm256_broadcast_ss(biasptr + 2);
            __m256 _sum3 = _mm256_broadcast_ss(biasptr + 3);
            __m256 _sum4 = _mm256_broadcast_ss(biasptr + 4);
            __m256 _sum5 = _mm256_broadcast_ss(biasptr + 5);
            __m256 _sum6 = _mm256_broadcast_ss(biasptr + 6);
            __m256 _sum7 = _mm256_broadcast_ss(biasptr + 7);

            for (int j = 0; j < nn; j++)
            {
                __m256 _val0 = _mm256_load_ps(tmpptr);

                __m256 _w0 = _mm256_broadcast_ss(kptr0);
                __m256 _w1 = _mm256_broadcast_ss(kptr0 + 1);
                _sum0 = _mm256_comp_fmadd_ps(_val0, _w0, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_val0, _w1, _sum1);
                __m256 _w2 = _mm256_broadcast_ss(kptr0 + 2);
                __m256 _w3 = _mm256_broadcast_ss(kptr0 + 3);
                _sum2 = _mm256_comp_fmadd_ps(_val0, _w2, _sum2);
                _sum3 = _mm256_comp_fmadd_ps(_val0, _w3, _sum3);
                __m256 _w4 = _mm256_broadcast_ss(kptr0 + 4);
                __m256 _w5 = _mm256_broadcast_ss(kptr0 + 5);
                _sum4 = _mm256_comp_fmadd_ps(_val0, _w4, _sum4);
                _sum5 = _mm256_comp_fmadd_ps(_val0, _w5, _sum5);
                __m256 _w6 = _mm256_broadcast_ss(kptr0 + 6);
                __m256 _w7 = _mm256_broadcast_ss(kptr0 + 7);
                _sum6 = _mm256_comp_fmadd_ps(_val0, _w6, _sum6);
                _sum7 = _mm256_comp_fmadd_ps(_val0, _w7, _sum7);

                tmpptr += 8;
                kptr0 += 8;
            }

            _mm256_storeu_ps(outptr0, _sum0);
            _mm256_storeu_ps(outptr1, _sum1);
            _mm256_storeu_ps(outptr2, _sum2);
            _mm256_storeu_ps(outptr3, _sum3);
            _mm256_storeu_ps(outptr4, _sum4);
            _mm256_storeu_ps(outptr5, _sum5);
            _mm256_storeu_ps(outptr6, _sum6);
            _mm256_storeu_ps(outptr7, _sum7);

            outptr0 += 8;
            outptr1 += 8;
            outptr2 += 8;
            outptr3 += 8;
            outptr4 += 8;
            outptr5 += 8;
            outptr6 += 8;
            outptr7 += 8;
        }
        for (; i < size; i++)
        {
            const float* tmpptr = tmp.channel(i / 8 + i % 8);
            const float* kptr0 = kernel.channel(p / 8);

            int nn = inch * maxk * 8; // inch always > 0

            __m256 _sum = _mm256_loadu_ps(biasptr);

            for (int j = 0; j < nn; j++)
            {
                __m256 _val0 = _mm256_broadcast_ss(tmpptr);
                __m256 _w0 = _mm256_load_ps(kptr0);
                _sum = _mm256_comp_fmadd_ps(_val0, _w0, _sum);

                tmpptr += 1;
                kptr0 += 8;
            }

            float sum[8];
            _mm256_storeu_ps(sum, _sum);

            outptr0[0] = sum[0];
            outptr1[0] = sum[1];
            outptr2[0] = sum[2];
            outptr3[0] = sum[3];
            outptr4[0] = sum[4];
            outptr5[0] = sum[5];
            outptr6[0] = sum[6];
            outptr7[0] = sum[7];

            outptr0 += 1;
            outptr1 += 1;
            outptr2 += 1;
            outptr3 += 1;
            outptr4 += 1;
            outptr5 += 1;
            outptr6 += 1;
            outptr7 += 1;
        }
    }

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = remain_outch_start; p < outch; p++)
    {
        float* outptr0 = top_blob.channel(p);

        const float bias0 = bias ? bias[p] : 0.f;

        int i = 0;
        for (; i + 7 < size; i += 8)
        {
            const float* tmpptr = tmp.channel(i / 8);
            const float* kptr0 = kernel.channel(p / 8 + p % 8);

            int nn = inch * maxk * 8; // inch always > 0

            __m256 _sum0 = _mm256_set1_ps(bias0);

            for (int j = 0; j < nn; j++)
            {
                __m256 _val0 = _mm256_load_ps(tmpptr);
                __m256 _w0 = _mm256_broadcast_ss(kptr0);
                _sum0 = _mm256_comp_fmadd_ps(_w0, _val0, _sum0);

                tmpptr += 8;
                kptr0 += 1;
            }

            _mm256_storeu_ps(outptr0, _sum0);
            outptr0 += 8;
        }
        for (; i < size; i++)
        {
            const float* tmpptr = tmp.channel(i / 8 + i % 8);
            const float* kptr0 = kernel.channel(p / 8 + p % 8);

            int nn = inch * maxk; // inch always > 0

            float sum0 = bias0;

            __m256 _sum0 = _mm256_setzero_ps();

            for (int j = 0; j < nn; j++)
            {
                __m256 _val0 = _mm256_load_ps(tmpptr);
                __m256 _w0 = _mm256_load_ps(kptr0);
                _sum0 = _mm256_comp_fmadd_ps(_val0, _w0, _sum0);

                tmpptr += 8;
                kptr0 += 8;
            }

            sum0 += _mm256_reduce_add_ps(_sum0);

            outptr0[0] = sum0;
            outptr0 += 1;
        }
    }
}